

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

cTValue * lj_ir_k64_find(jit_State *J,uint64_t u64)

{
  uint uVar1;
  uint *puVar2;
  uint64_t in_RSI;
  long in_RDI;
  K64Array *kn;
  TValue *tv;
  MSize idx;
  TValue *ntv;
  K64Array *kp;
  K64Array *k;
  cTValue *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  lua_State *in_stack_ffffffffffffffd0;
  uint *local_28;
  uint *local_20;
  
  local_28 = (uint *)0x0;
  uVar1 = *(uint *)(in_RDI + 0xd4);
  do {
    local_20 = (uint *)(ulong)uVar1;
    if (local_20 == (uint *)0x0) {
      if ((local_28 == (uint *)0x0) || (0xf < local_28[1])) {
        puVar2 = (uint *)lj_mem_realloc(in_stack_ffffffffffffffd0,
                                        (void *)CONCAT44(in_stack_ffffffffffffffcc,
                                                         in_stack_ffffffffffffffc8),
                                        (MSize)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                                        (MSize)in_stack_ffffffffffffffc0);
        *puVar2 = 0;
        puVar2[1] = 0;
        if (local_28 == (uint *)0x0) {
          *(uint *)(in_RDI + 0xd4) = (uint)puVar2;
          local_28 = puVar2;
        }
        else {
          *local_28 = (uint)puVar2;
          local_28 = puVar2;
        }
      }
      uVar1 = local_28[1];
      local_28[1] = uVar1 + 1;
      ((cTValue *)(local_28 + (ulong)uVar1 * 2 + 2))->u64 = in_RSI;
      return (cTValue *)(local_28 + (ulong)uVar1 * 2 + 2);
    }
    local_28 = local_20;
    for (in_stack_ffffffffffffffcc = 0; in_stack_ffffffffffffffcc < local_20[1];
        in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc + 1) {
      in_stack_ffffffffffffffc0 = (cTValue *)(local_20 + (ulong)in_stack_ffffffffffffffcc * 2 + 2);
      if (in_stack_ffffffffffffffc0->u64 == in_RSI) {
        return in_stack_ffffffffffffffc0;
      }
    }
    uVar1 = *local_20;
  } while( true );
}

Assistant:

cTValue *lj_ir_k64_find(jit_State *J, uint64_t u64)
{
  K64Array *k, *kp = NULL;
  TValue *ntv;
  MSize idx;
  /* Search for the constant in the whole chain of arrays. */
  for (k = mref(J->k64, K64Array); k; k = mref(k->next, K64Array)) {
    kp = k;  /* Remember previous element in list. */
    for (idx = 0; idx < k->numk; idx++) {  /* Search one array. */
      TValue *tv = &k->k[idx];
      if (tv->u64 == u64)  /* Needed for +-0/NaN/absmask. */
	return tv;
    }
  }
  /* Constant was not found, need to add it. */
  if (!(kp && kp->numk < LJ_MIN_K64SZ)) {  /* Allocate a new array. */
    K64Array *kn = lj_mem_newt(J->L, sizeof(K64Array), K64Array);
    setmref(kn->next, NULL);
    kn->numk = 0;
    if (kp)
      setmref(kp->next, kn);  /* Chain to the end of the list. */
    else
      setmref(J->k64, kn);  /* Link first array. */
    kp = kn;
  }
  ntv = &kp->k[kp->numk++];  /* Add to current array. */
  ntv->u64 = u64;
  return ntv;
}